

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O1

void __thiscall json_service::json_service(json_service *this,service *srv)

{
  _Any_data local_2b8;
  _Manager_type local_2a8;
  code *pcStack_2a0;
  undefined8 *local_298;
  undefined8 uStack_290;
  code *local_288;
  code *pcStack_280;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  cppcms::rpc::json_rpc_server::json_rpc_server(&this->super_json_rpc_server,srv);
  *(undefined ***)this = &PTR__json_rpc_server_00115a30;
  local_2b8._M_unused._M_object = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"sum","");
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298 = (undefined8 *)0x0;
  uStack_290 = 0;
  local_298 = (undefined8 *)operator_new(0x18);
  *local_298 = this;
  local_298[1] = sum;
  local_298[2] = 0;
  pcStack_280 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder2<json_service,_json_service_*,_int,_int>_>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder2<json_service,_json_service_*,_int,_int>_>
              ::_M_manager;
  cppcms::rpc::json_rpc_server::bind(this,&local_2b8,&local_298,1);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if ((_Manager_type *)local_2b8._M_unused._0_8_ != &local_2a8) {
    operator_delete(local_2b8._M_unused._M_object);
  }
  local_2b8._M_unused._M_object = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"div","");
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298 = (undefined8 *)0x0;
  uStack_290 = 0;
  local_298 = (undefined8 *)operator_new(0x18);
  *local_298 = this;
  local_298[1] = div;
  local_298[2] = 0;
  pcStack_280 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder2<json_service,_json_service_*,_int,_int>_>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder2<json_service,_json_service_*,_int,_int>_>
              ::_M_manager;
  cppcms::rpc::json_rpc_server::bind(this,&local_2b8,&local_298,1);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if ((_Manager_type *)local_2b8._M_unused._0_8_ != &local_2a8) {
    operator_delete(local_2b8._M_unused._M_object);
  }
  local_2b8._M_unused._M_object = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"notify","");
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298 = (undefined8 *)0x0;
  uStack_290 = 0;
  local_298 = (undefined8 *)operator_new(0x18);
  *local_298 = this;
  local_298[1] = div;
  local_298[2] = 0;
  pcStack_280 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder2<json_service,_json_service_*,_int,_int>_>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder2<json_service,_json_service_*,_int,_int>_>
              ::_M_manager;
  cppcms::rpc::json_rpc_server::bind(this,&local_2b8,&local_298,2);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if ((_Manager_type *)local_2b8._M_unused._0_8_ != &local_2a8) {
    operator_delete(local_2b8._M_unused._M_object);
  }
  local_2b8._M_unused._M_object = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"both","");
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298 = (undefined8 *)0x0;
  uStack_290 = 0;
  local_298 = (undefined8 *)operator_new(0x18);
  *local_298 = this;
  local_298[1] = both;
  local_298[2] = 0;
  pcStack_280 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_manager;
  cppcms::rpc::json_rpc_server::bind(this,&local_2b8,&local_298,0);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if ((_Manager_type *)local_2b8._M_unused._0_8_ != &local_2a8) {
    operator_delete(local_2b8._M_unused._M_object);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Checking bindings",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles1c;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_int>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_int>_>
              ::_M_manager;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[10]","");
  check_method(this,(method_type *)&local_2b8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles2c;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_manager;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[\"str\"]","");
  check_method(this,(method_type *)&local_2b8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles3c;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_>_>
              ::_M_manager;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[[1,2]]","");
  check_method(this,(method_type *)&local_2b8,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles4c;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_cppcms::json::value>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_cppcms::json::value>_>
              ::_M_manager;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[{}]","");
  check_method(this,(method_type *)&local_2b8,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles5c;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>_>
              ::_M_manager;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"[{\"member\":1}]","");
  check_method(this,(method_type *)&local_2b8,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles6c;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>_>
              ::_M_manager;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"[[1]]","");
  check_method(this,(method_type *)&local_2b8,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles1cr;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_int_&>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_int_&>_>
              ::_M_manager;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"[10]","");
  check_method(this,(method_type *)&local_2b8,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles2cr;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
              ::_M_manager;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"[\"str\"]","");
  check_method(this,(method_type *)&local_2b8,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles3cr;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::vector<int,_std::allocator<int>_>_&>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::vector<int,_std::allocator<int>_>_&>_>
              ::_M_manager;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"[[1,2]]","");
  check_method(this,(method_type *)&local_2b8,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles4cr;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_cppcms::json::value_&>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_cppcms::json::value_&>_>
              ::_M_manager;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"[{}]","");
  check_method(this,(method_type *)&local_2b8,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles5cr;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_&>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_&>_>
              ::_M_manager;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"[{\"member\":1}]","");
  check_method(this,(method_type *)&local_2b8,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles6cr;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&>_>
              ::_M_manager;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"[[1]]","");
  check_method(this,(method_type *)&local_2b8,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles1v;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_int>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_int>_>
              ::_M_manager;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"[10]","");
  check_method(this,(method_type *)&local_2b8,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles2v;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_manager;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"[\"str\"]","");
  check_method(this,(method_type *)&local_2b8,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles3v;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_>_>
              ::_M_manager;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"[[1,2]]","");
  check_method(this,(method_type *)&local_2b8,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles4v;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_cppcms::json::value>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_cppcms::json::value>_>
              ::_M_manager;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"[{}]","");
  check_method(this,(method_type *)&local_2b8,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles5v;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>_>
              ::_M_manager;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"[{\"member\":1}]","");
  check_method(this,(method_type *)&local_2b8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  local_2a8 = (_Manager_type)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x18);
  *(json_service **)local_2b8._M_unused._0_8_ = this;
  *(code **)((long)local_2b8._M_unused._0_8_ + 8) = compiles6v;
  *(undefined8 *)((long)local_2b8._M_unused._0_8_ + 0x10) = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>_>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&),_cppcms::rpc::details::binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>_>
              ::_M_manager;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"[[1]]","");
  check_method(this,(method_type *)&local_2b8,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (local_2a8 != (_Manager_type)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_2b8._M_unused._M_object = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"{}","");
  cppcms::rpc::json_rpc_server::smd_raw((string *)this);
  if ((_Manager_type *)local_2b8._M_unused._0_8_ != &local_2a8) {
    operator_delete(local_2b8._M_unused._M_object);
  }
  return;
}

Assistant:

json_service(cppcms::service &srv) : cppcms::rpc::json_rpc_server(srv)
	{
		bind("sum",cppcms::rpc::json_method(&json_service::sum,this),method_role);
		bind("div",cppcms::rpc::json_method(&json_service::div,this),method_role);
		bind("notify",cppcms::rpc::json_method(&json_service::div,this),notification_role);
		bind("both",cppcms::rpc::json_method(&json_service::both,this));

		std::cout << "Checking bindings" << std::endl;
		check_method(cppcms::rpc::json_method(&json_service::compiles1c,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2c,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3c,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4c,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5c,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6c,this),"[[1]]");
		
		check_method(cppcms::rpc::json_method(&json_service::compiles1cr,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2cr,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3cr,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4cr,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5cr,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6cr,this),"[[1]]");

		check_method(cppcms::rpc::json_method(&json_service::compiles1v,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2v,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3v,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4v,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5v,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6v,this),"[[1]]");

		std::cout << "Ok" << std::endl;

		smd_raw("{}");
	}